

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emithelper.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseEmitHelper::emitArgsAssignment
          (BaseEmitHelper *this,FuncFrame *frame,FuncArgsAssignment *args)

{
  bool bVar1;
  OperandSignature OVar2;
  uint uVar3;
  Error EVar4;
  OperandSignature *pOVar5;
  InstHints *pIVar6;
  uint *puVar7;
  ulong uVar8;
  WorkData *in_RSI;
  long *in_RDI;
  Error _err_6;
  BaseMem srcMem;
  BaseReg dstReg;
  WorkData *wd_3;
  RegGroup group;
  RegType outType;
  uint32_t outId_1;
  Var *var_2;
  uint32_t varId_2;
  uint32_t iter;
  BaseMem baseArgPtr_1;
  uint32_t iterCount;
  RegMask inOutRegs;
  RegMask availableRegs_1;
  Error _err_5;
  OperandSignature signature_1;
  RegType highestType;
  Var *altVar;
  uint32_t altId;
  Error _err_4;
  WorkData *wd_2;
  uint32_t outId;
  uint32_t curId;
  RegGroup outGroup;
  RegGroup curGroup;
  FuncValue *out_1;
  FuncValue *cur_1;
  Var *var_1;
  uint32_t varId_1;
  uint32_t workFlags;
  Error _err_3;
  Error _err_2;
  uint32_t availableId;
  RegMask availableRegs;
  WorkData *wd_1;
  OperandSignature signature;
  uint32_t regId;
  WorkData *wd;
  BaseMem srcStackPtr;
  BaseMem dstStackPtr;
  BaseReg reg;
  FuncValue *out;
  FuncValue *cur;
  Var *var;
  uint32_t varId;
  BaseMem baseStackPtr;
  BaseMem baseArgPtr;
  BaseReg sa;
  BaseReg sp;
  uint32_t saVarId;
  uint32_t varCount;
  Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL> *workData;
  Error _err_1;
  Error _err;
  FuncArgsContext ctx;
  RAConstraints constraints;
  ArchTraits *archTraits;
  Arch arch;
  uint32_t in_stack_ffffffffffffee98;
  uint32_t in_stack_ffffffffffffee9c;
  uint32_t varId_00;
  WorkData *in_stack_ffffffffffffeea0;
  WorkData *this_00;
  uint in_stack_ffffffffffffeea8;
  undefined1 in_stack_ffffffffffffeeac;
  undefined1 in_stack_ffffffffffffeead;
  byte in_stack_ffffffffffffeeae;
  undefined1 in_stack_ffffffffffffeeaf;
  WorkData *in_stack_ffffffffffffeeb0;
  bool local_1145;
  uint32_t local_1144;
  FuncArgsContext *in_stack_ffffffffffffeec0;
  uint local_1134;
  Operand_ local_1124;
  uint32_t local_1114;
  uint32_t local_1110;
  uint local_110c;
  undefined4 local_1108;
  undefined4 local_1104;
  WorkData *local_1100;
  byte local_10f6;
  byte local_10f5;
  undefined4 in_stack_ffffffffffffef0c;
  uint local_10e4;
  uint local_10e0;
  Signature local_10dc;
  uint uStack_10d8;
  uint32_t local_10d4;
  uint32_t uStack_10d0;
  uint local_10cc;
  uint local_10c8;
  uint local_10c4;
  uint32_t local_10c0;
  uint local_10bc;
  undefined4 local_10b8;
  undefined4 local_10b4;
  uint32_t local_10b0;
  uint local_10ac;
  undefined4 local_10a8;
  undefined4 local_10a4;
  Error local_10a0;
  uint32_t local_109c;
  undefined1 local_1095;
  undefined1 local_1094;
  byte local_1093;
  byte local_1092;
  byte local_1091;
  uint *local_1090;
  uint local_1088;
  uint32_t local_1084;
  uint32_t local_1080;
  uint local_107c;
  undefined4 local_1078;
  undefined4 local_1074;
  uint32_t local_1070;
  uint32_t local_106c;
  uint local_1068;
  undefined4 local_1064;
  undefined4 local_1060;
  Error local_105c;
  WorkData *local_1058;
  uint local_104c;
  uint local_1048;
  byte local_1042;
  byte local_1041;
  uint *local_1040;
  uint *local_1038;
  uint *local_1030;
  uint local_1028;
  uint local_1024;
  undefined4 local_1020;
  undefined1 local_1019;
  undefined4 local_1018;
  uint local_1014;
  undefined4 in_stack_ffffffffffffeff0;
  undefined4 in_stack_ffffffffffffeff4;
  FuncArgsAssignment *in_stack_ffffffffffffeff8;
  undefined4 in_stack_fffffffffffff000;
  undefined4 in_stack_fffffffffffff004;
  undefined4 in_stack_fffffffffffff008;
  undefined4 in_stack_fffffffffffff00c;
  Operand_ local_fe8;
  Operand_ local_fd8;
  uint32_t local_fc8;
  uint local_fc4;
  undefined4 local_fc0;
  undefined4 local_fbc;
  uint *local_fb8;
  uint *local_fb0;
  uint *local_fa8;
  uint local_f9c;
  Signature local_f98;
  uint uStack_f94;
  uint32_t local_f90;
  uint32_t uStack_f8c;
  Signature local_f88;
  uint uStack_f84;
  uint32_t local_f80;
  uint32_t uStack_f7c;
  undefined8 local_f78;
  undefined8 local_f70;
  uint local_f68;
  uint uStack_f64;
  undefined4 local_f60;
  undefined4 uStack_f5c;
  uint local_f58;
  uint local_f54;
  WorkData *local_f50;
  Error local_f48;
  Error local_f44;
  byte local_f2f;
  char local_f2d;
  byte local_f2b;
  uint local_f28;
  WorkData aWStack_f24 [4];
  uint auStack_e24 [45];
  char *in_stack_fffffffffffff290;
  int in_stack_fffffffffffff29c;
  char *in_stack_fffffffffffff2a0;
  RAConstraints local_a18;
  byte *local_a08;
  byte local_9f9;
  WorkData *local_9f0;
  Error local_9dc;
  byte local_9c9;
  byte *local_9c8;
  uint local_9bc;
  uint *local_9b8;
  uint *local_9b0;
  uint local_9a4;
  uint32_t *local_9a0;
  uint32_t *local_998;
  uint local_98c;
  uint32_t *local_988;
  uint32_t *local_980;
  uint local_974;
  uint32_t *local_970;
  uint32_t *local_968;
  uint local_95c;
  uint32_t *local_958;
  uint32_t *local_950;
  uint local_944;
  uint32_t *local_940;
  uint32_t *local_938;
  uint *local_930;
  undefined8 *local_928;
  WorkData *local_920;
  WorkData *local_918;
  WorkData *local_910;
  WorkData *local_908;
  uint local_8fc;
  undefined8 *local_8f8;
  uint local_8ec;
  undefined8 *local_8e8;
  uint local_8dc;
  undefined8 *local_8d8;
  byte *local_8d0;
  uint *local_8c8;
  uint *local_8c0;
  uint *local_8b8;
  uint *local_8b0;
  uint *local_8a8;
  uint *local_8a0;
  uint *local_898;
  uint *local_890;
  uint *local_888;
  uint *local_880;
  WorkData *local_878;
  WorkData *local_870;
  uint local_864;
  WorkData *local_860;
  uint local_854;
  WorkData *local_850;
  undefined8 *local_848;
  undefined8 *local_840;
  undefined8 *local_838;
  uint local_830 [3];
  uint32_t local_824;
  undefined8 *local_820;
  Signature *local_818;
  undefined8 *local_810;
  uint local_808 [3];
  undefined4 local_7fc;
  uint *local_7f8;
  Signature *local_7f0;
  uint *local_7e8;
  uint local_7e0 [3];
  uint32_t local_7d4;
  undefined8 *local_7d0;
  Signature *local_7c8;
  undefined8 *local_7c0;
  uint *local_7b8;
  uint *local_7b0;
  uint *local_7a8;
  uint *local_7a0;
  uint *local_798;
  uint *local_790;
  uint *local_788;
  uint *local_780;
  uint *local_778;
  uint *local_770;
  undefined4 local_764;
  uint32_t *local_760;
  long local_758;
  Signature *local_750;
  Operand_ *local_748;
  long local_740;
  Signature *local_738;
  Operand_ *local_730;
  long local_728;
  Signature *local_720;
  Operand_ *local_718;
  uint *local_710;
  uint *local_708;
  uint *local_700;
  uint *local_6f8;
  uint *local_6f0;
  uint *local_6e8;
  uint local_6dc;
  Operand_ *local_6d8;
  byte local_6c9;
  byte *local_6c8;
  undefined1 local_6b9;
  byte *local_6b8;
  undefined1 local_6a9;
  byte *local_6a8;
  undefined1 local_699;
  byte *local_698;
  uint *local_690;
  uint *local_688;
  uint *local_680;
  uint *local_678;
  uint *local_670;
  uint *local_668;
  uint *local_660;
  uint *local_658;
  uint *local_650;
  uint *local_648;
  uint local_63c;
  undefined1 *local_638;
  uint32_t *local_630;
  uint local_624;
  undefined1 *local_620;
  uint32_t *local_618;
  byte local_609;
  byte *local_608;
  uint32_t local_600;
  byte local_5f9;
  byte *local_5f8;
  uint32_t local_5f0;
  undefined1 local_5e9;
  byte *local_5e8;
  uint32_t local_5e0;
  undefined1 local_5d9;
  byte *local_5d8;
  uint32_t local_5d0;
  undefined1 local_5c9;
  byte *local_5c8;
  uint32_t local_5bc;
  uint *local_5b8;
  uint *local_5b0;
  uint *local_5a8;
  uint *local_5a0;
  uint *local_598;
  uint *local_590;
  uint *local_588;
  uint *local_580;
  uint *local_578;
  uint *local_570;
  uint *local_568;
  undefined1 *local_560;
  OperandSignature *local_558;
  OperandSignature *local_550;
  OperandSignature *local_548;
  OperandSignature *local_540;
  undefined1 *local_538;
  WorkData *local_530;
  WorkData *local_528;
  uint local_520;
  uint local_51c;
  uint local_518;
  uint local_514;
  uint *local_510;
  uint *local_508;
  uint *local_500;
  uint *local_4f8;
  uint *local_4f0;
  uint *local_4e8;
  undefined4 local_4e0;
  undefined1 local_4d9;
  uint local_4d8;
  byte local_4d1;
  uint *local_4d0;
  undefined4 local_4c8;
  undefined1 local_4c1;
  uint local_4c0;
  byte local_4b9;
  uint *local_4b8;
  uint *local_4b0;
  uint *local_4a8;
  byte local_499;
  byte *local_498;
  byte *local_490;
  byte *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  byte *local_470;
  uint local_464;
  uint *local_460;
  uint local_454;
  uint *local_450;
  WorkData *local_448;
  uint *local_440;
  uint *local_438;
  undefined4 local_42c;
  undefined4 local_428;
  undefined4 local_424;
  undefined4 *local_420;
  uint32_t *local_418;
  uint32_t local_40c;
  undefined4 local_408;
  uint local_404;
  uint *local_400;
  Signature *local_3f8;
  undefined4 local_3ec;
  undefined4 local_3e8;
  uint local_3e4;
  uint *local_3e0;
  Signature *local_3d8;
  uint32_t local_3cc;
  undefined4 local_3c8;
  uint local_3c4;
  uint *local_3c0;
  Signature *local_3b8;
  undefined4 local_3ac;
  undefined4 local_3a8;
  uint local_3a4;
  uint32_t *local_3a0;
  uint32_t *local_398;
  undefined4 local_38c;
  undefined4 local_388;
  uint local_384;
  uint32_t *local_380;
  uint32_t *local_378;
  undefined4 local_36c;
  undefined4 local_368;
  uint local_364;
  uint32_t *local_360;
  uint32_t *local_358;
  undefined4 local_34c;
  undefined4 local_348;
  uint local_344;
  uint32_t *local_340;
  uint32_t *local_338;
  undefined4 local_32c;
  undefined4 local_328;
  uint local_324;
  uint32_t *local_320;
  uint32_t *local_318;
  undefined4 local_30c;
  undefined4 local_308;
  uint local_304;
  uint *local_300;
  uint *local_2f8;
  undefined4 local_2ec;
  WorkData *local_2e8;
  undefined4 local_2dc;
  WorkData *local_2d8;
  WorkData *local_2d0;
  WorkData *local_2c8;
  WorkData *local_2c0;
  WorkData *local_2b8;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  uint *local_290;
  uint *local_288;
  uint local_27c;
  uint *local_278;
  uint *local_270;
  uint local_264;
  uint *local_260;
  uint *local_258;
  uint local_24c;
  byte local_245;
  uint local_244;
  byte local_23d;
  uint local_23c;
  byte local_235;
  uint local_234;
  undefined8 *local_230;
  uint *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  uint *local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  uint *local_1f8;
  undefined8 *local_1f0;
  undefined4 local_1e4;
  uint *local_1e0;
  undefined4 local_1d4;
  uint *local_1d0;
  undefined4 local_1c4;
  uint *local_1c0;
  undefined4 local_1b4;
  uint *local_1b0;
  undefined4 local_1a4;
  uint *local_1a0;
  undefined4 local_194;
  uint *local_190;
  undefined4 local_184;
  uint *local_180;
  undefined4 local_174;
  uint *local_170;
  undefined4 local_164;
  uint *local_160;
  undefined4 local_154;
  uint *local_150;
  undefined4 local_144;
  uint *local_140;
  undefined4 local_134;
  uint *local_130;
  undefined4 local_124;
  uint *local_120;
  Signature *local_118;
  Operand_ *local_110;
  Signature *local_108;
  Operand_ *local_100;
  Signature *local_f8;
  Operand_ *local_f0;
  undefined1 local_e2;
  byte local_e1;
  undefined1 *local_e0;
  OperandSignature *local_d8;
  OperandSignature *local_d0;
  OperandSignature *local_c8;
  OperandSignature *local_c0;
  undefined4 local_b4;
  uint *local_b0;
  undefined4 local_a4;
  uint *local_a0;
  undefined4 local_94;
  uint *local_90;
  undefined4 local_84;
  uint *local_80;
  uint *local_78;
  undefined4 local_6c;
  uint *local_68;
  uint *local_60;
  undefined4 local_54;
  uint *local_50;
  InstHints local_42;
  byte local_41;
  byte *local_40;
  byte local_34;
  byte local_33;
  undefined1 local_32;
  byte local_31;
  uint local_30;
  undefined4 local_2c;
  uint *local_28;
  uint local_20;
  undefined4 local_1c;
  uint *local_18;
  uint *local_10;
  uint *local_8;
  
  local_9f9 = (byte)in_RSI->_workRegs;
  local_a08 = _archTraits + (ulong)local_9f9 * 0xd8;
  local_9f0 = in_RSI;
  local_9c9 = local_9f9;
  RAConstraints::RAConstraints((RAConstraints *)0x1327ae);
  FuncArgsContext::FuncArgsContext(in_stack_ffffffffffffeec0);
  local_f44 = RAConstraints::init(&local_a18,(EVP_PKEY_CTX *)(ulong)local_9f9);
  local_9dc = local_f44;
  if ((local_f44 == 0) &&
     (local_f48 = FuncArgsContext::initWorkData
                            ((FuncArgsContext *)
                             CONCAT44(in_stack_fffffffffffff00c,in_stack_fffffffffffff008),
                             (FuncFrame *)
                             CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                             in_stack_ffffffffffffeff8,
                             (RAConstraints *)
                             CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0)),
     local_9dc = local_f48, local_f48 == 0)) {
    local_f50 = aWStack_f24;
    local_f54 = local_f28;
    local_f58 = (uint)local_f2b;
    local_9b8 = (uint *)(in_RDI[1] + 0x50);
    local_9c8 = local_a08;
    local_9b0 = &local_f68;
    local_9bc = (uint)*local_a08;
    local_308 = 0;
    local_30c = 0;
    local_f68 = *local_9b8;
    local_f60 = 0;
    uStack_f5c = 0;
    local_928 = &local_f78;
    local_930 = &local_f68;
    local_f78 = (ulong)CONCAT14(*local_a08,local_f68);
    local_f70 = 0;
    local_918 = local_9f0;
    local_304 = local_9bc;
    local_300 = local_9b8;
    local_2f8 = local_9b0;
    uStack_f64 = local_9bc;
    if (*(byte *)((long)&local_9f0->_usedRegs + 2) <= *(byte *)((long)&local_9f0->_assignedRegs + 1)
       ) {
      local_908 = local_9f0;
      local_2e8 = local_9f0;
      local_2ec = 0x10;
      bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                        (((WorkData *)&local_9f0->_archRegs)->_archRegs,kHasPreservedFP);
      if (bVar1) {
        local_8d0 = local_a08;
        local_8d8 = &local_f78;
        local_8dc = (uint)local_a08[1];
        local_f78 = (ulong)CONCAT14(local_a08[1],(uint)local_f78);
      }
      else {
        if (local_f58 < local_f54) {
          local_880 = auStack_e24 + (ulong)local_f58 * 2;
          local_1134 = (*local_880 & 0xff0000) >> 0x10;
        }
        else {
          local_870 = local_9f0;
          local_1134 = (uint)*(byte *)((long)&local_9f0->_workRegs + 2);
        }
        local_8e8 = &local_f78;
        local_8ec = local_1134;
        local_f78 = CONCAT44(local_1134,(uint)local_f78);
      }
    }
    if (local_f2d != '\0') {
      local_838 = &local_f78;
      local_854 = local_f78._4_4_;
      local_850 = local_9f0;
      if (local_f78._4_4_ == *(byte *)((long)&local_9f0->_workRegs + 1)) {
        local_2d0 = local_9f0;
        local_1144 = ((OperandSignature *)(local_9f0->_physToVarId + 4))->_bits;
      }
      else {
        local_2c0 = local_9f0;
        local_1144 = ((OperandSignature *)(local_9f0->_physToVarId + 8))->_bits;
      }
      local_818 = &local_f88;
      local_820 = &local_f78;
      local_824 = local_1144;
      local_298 = 2;
      local_294 = 2;
      local_830[1] = 2;
      local_235 = (byte)((uint)local_f78 >> 3) & 0x1f;
      local_830[0] = (uint)local_235 << 3;
      local_258 = local_830 + 1;
      local_260 = local_830;
      local_830[2] = local_830[0] | 2;
      local_3c4 = local_f78._4_4_;
      local_3c0 = local_830 + 2;
      local_3c8 = 0;
      local_3cc = local_1144;
      uStack_f84 = local_f78._4_4_;
      local_f80 = 0;
      uStack_f7c = local_1144;
      local_7f0 = &local_f98;
      local_7f8 = &local_f68;
      local_7fc = 0;
      local_2a0 = 2;
      local_29c = 2;
      local_808[1] = 2;
      local_23d = (byte)(local_f68 >> 3) & 0x1f;
      local_808[0] = (uint)local_23d << 3;
      local_270 = local_808 + 1;
      local_278 = local_808;
      local_808[2] = local_808[0] | 2;
      local_3e4 = uStack_f64;
      local_3e0 = local_808 + 2;
      local_3e8 = 0;
      local_3ec = 0;
      uStack_f94 = uStack_f64;
      local_f90 = 0;
      uStack_f8c = 0;
      local_810 = local_820;
      local_7e8 = local_7f8;
      local_3d8 = local_7f0;
      local_3b8 = local_818;
      local_264 = local_808[2];
      local_24c = local_830[2];
      local_23c = local_808[0];
      local_234 = local_830[0];
      local_228 = local_7f8;
      local_220 = local_820;
      local_218 = local_820;
      local_210 = local_7f8;
      local_1f8 = local_7f8;
      local_1f0 = local_820;
      local_f98._bits = local_808[2];
      local_f88._bits = local_830[2];
      for (local_f9c = 0; local_f9c < local_f54; local_f9c = local_f9c + 1) {
        local_fa8 = auStack_e24 + (ulong)local_f9c * 2;
        local_7a0 = auStack_e24 + (ulong)local_f9c * 2 + 1;
        local_154 = 0x200;
        local_150 = local_7a0;
        bVar1 = Support::test<unsigned_int,unsigned_int>(*local_7a0,0x200);
        if (bVar1) {
          local_fb0 = local_fa8;
          local_fb8 = local_fa8 + 1;
          local_770 = local_fa8;
          local_1b0 = local_fa8;
          local_1b4 = 0x100;
          bVar1 = Support::test<unsigned_int,unsigned_int>(*local_fa8,0x100);
          local_1145 = true;
          if (!bVar1) {
            local_7a8 = local_fb0;
            local_140 = local_fb0;
            local_144 = 0x200;
            local_1145 = Support::test<unsigned_int,unsigned_int>(*local_fb0,0x200);
          }
          if (local_1145 == false) {
            DebugUtils::assertionFailed
                      (in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c,in_stack_fffffffffffff290
                      );
          }
          local_760 = &local_fc8;
          local_2b0 = 1;
          local_2ac = 1;
          local_764 = 1;
          local_420 = &local_764;
          local_424 = 0xff;
          local_428 = 0;
          local_42c = 0;
          local_fc8 = 1;
          local_fc4 = 0xff;
          local_fc0 = 0;
          local_fbc = 0;
          local_700 = local_fb8;
          local_728 = (long)((int)*local_fb8 >> 0xc);
          local_718 = &local_fd8;
          local_720 = &local_f98;
          local_110 = &local_fd8;
          local_fd8._baseId = uStack_f94;
          local_fd8._signature._bits = local_f98._bits;
          local_fd8._data[1] = uStack_f8c;
          local_fd8._data[0] = local_f90;
          local_418 = local_760;
          local_118 = local_720;
          BaseMem::addOffset((BaseMem *)&local_fd8,local_728);
          local_708 = local_fb0;
          local_740 = (long)((int)*local_fb0 >> 0xc);
          local_730 = &local_fe8;
          local_738 = &local_f88;
          local_100 = &local_fe8;
          local_fe8._baseId = uStack_f84;
          local_fe8._signature._bits = local_f88._bits;
          local_fe8._data[1] = uStack_f7c;
          local_fe8._data[0] = local_f80;
          local_108 = local_738;
          BaseMem::addOffset((BaseMem *)&local_fe8,local_740);
          local_6e8 = local_fb0;
          local_1e0 = local_fb0;
          local_1e4 = 0x400;
          bVar1 = Support::test<unsigned_int,unsigned_int>(*local_fb0,0x400);
          if (bVar1) {
            local_7b0 = local_fb0;
            local_130 = local_fb0;
            local_134 = 0x200;
            bVar1 = Support::test<unsigned_int,unsigned_int>(*local_fb0,0x200);
            if (bVar1) {
              EVar4 = DebugUtils::errored(0x19);
              return EVar4;
            }
            local_888 = local_fb0;
            local_6dc = (*local_fb0 & 0xff0000) >> 0x10;
            local_6d8 = &local_fe8;
            local_fe8._baseId = local_6dc;
          }
          local_778 = local_fb0;
          local_1a0 = local_fb0;
          local_1a4 = 0x100;
          bVar1 = Support::test<unsigned_int,unsigned_int>(*local_fb0,0x100);
          if (bVar1) {
            local_6f0 = local_fb0;
            local_1d0 = local_fb0;
            local_1d4 = 0x400;
            bVar1 = Support::test<unsigned_int,unsigned_int>(*local_fb0,0x400);
            if (bVar1) goto LAB_00133512;
            local_648 = local_fb0;
            local_698 = local_a08;
            local_699 = (undefined1)(*local_fb0 >> 0x18);
            in_stack_ffffffffffffeeb0 = local_f50;
            local_558 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                        operator[]<asmjit::v1_14::RegType>
                                  ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                   in_stack_ffffffffffffeea0,
                                   (RegType *)
                                   CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
            local_c0 = local_558;
            Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
            operator[]<asmjit::v1_14::RegGroup>
                      ((Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL> *)
                       in_stack_ffffffffffffeea0,
                       (RegGroup *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
            local_890 = local_fb0;
            uVar3 = (*local_fb0 & 0xff0000) >> 0x10;
            local_650 = local_fb0;
            local_5c8 = local_a08;
            local_5c9 = (undefined1)(*local_fb0 >> 0x18);
            pOVar5 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                     operator[]<asmjit::v1_14::RegType>
                               ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                in_stack_ffffffffffffeea0,
                                (RegType *)
                                CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
            local_5bc = pOVar5->_bits;
            local_618 = &local_fc8;
            local_620 = &stack0xfffffffffffff004;
            local_624 = uVar3;
            local_fc8 = local_5bc;
            local_fc4 = uVar3;
            FuncArgsContext::WorkData::unassign
                      ((WorkData *)
                       CONCAT17(in_stack_ffffffffffffeeaf,
                                CONCAT16(in_stack_ffffffffffffeeae,
                                         CONCAT15(in_stack_ffffffffffffeead,
                                                  CONCAT14(in_stack_ffffffffffffeeac,
                                                           in_stack_ffffffffffffeea8)))),
                       (uint32_t)((ulong)in_stack_ffffffffffffeea0 >> 0x20),
                       (uint32_t)in_stack_ffffffffffffeea0);
          }
          else {
LAB_00133512:
            local_568 = local_fb8;
            local_570 = local_fb0;
            OVar2 = getSuitableRegForMemToMemMove
                              ((Arch)((uint)in_stack_ffffffffffffef0c >> 0x18),
                               (TypeId)((uint)in_stack_ffffffffffffef0c >> 0x10),
                               (TypeId)((uint)in_stack_ffffffffffffef0c >> 8));
            local_560 = &stack0xfffffffffffff000;
            if (OVar2._bits == 0) {
              EVar4 = DebugUtils::errored(3);
              return EVar4;
            }
            local_538 = &stack0xfffffffffffff000;
            local_e0 = local_538;
            local_528 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                        operator[]<asmjit::v1_14::RegGroup>
                                  ((Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL> *)
                                   in_stack_ffffffffffffeea0,
                                   (RegGroup *)
                                   CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
            uVar3 = local_528->_workRegs & (local_528->_assignedRegs ^ 0xffffffff);
            if (uVar3 == 0) {
              EVar4 = DebugUtils::errored(3);
              return EVar4;
            }
            local_440 = &local_514;
            local_10 = &local_518;
            local_1014 = 0;
            if (uVar3 != 0) {
              for (; (uVar3 >> local_1014 & 1) == 0; local_1014 = local_1014 + 1) {
              }
            }
            local_630 = &local_fc8;
            local_638 = &stack0xfffffffffffff000;
            local_578 = local_fb8;
            local_580 = local_fb0;
            local_63c = local_1014;
            local_518 = uVar3;
            local_514 = uVar3;
            local_fc8 = OVar2._bits;
            local_fc4 = local_1014;
            EVar4 = (**(code **)(*in_RDI + 0x20))
                              (in_RDI,&local_fc8,(char)*local_fb8,&local_fe8,(char)*local_fb0);
            if (EVar4 != 0) {
              return EVar4;
            }
            local_1018 = 0;
          }
          local_6f8 = local_fb0;
          local_1c0 = local_fb0;
          local_1c4 = 0x400;
          bVar1 = Support::test<unsigned_int,unsigned_int>(*local_fb0,0x400);
          if (bVar1) {
            local_780 = local_fb0;
            local_190 = local_fb0;
            local_194 = 0x100;
            bVar1 = Support::test<unsigned_int,unsigned_int>(*local_fb0,0x100);
            if (bVar1) {
              local_1019 = 0;
              Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
              operator[]<asmjit::v1_14::RegGroup>
                        ((Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL> *)
                         in_stack_ffffffffffffeea0,
                         (RegGroup *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
              local_898 = local_fb0;
              FuncArgsContext::WorkData::unassign
                        ((WorkData *)
                         CONCAT17(in_stack_ffffffffffffeeaf,
                                  CONCAT16(in_stack_ffffffffffffeeae,
                                           CONCAT15(in_stack_ffffffffffffeead,
                                                    CONCAT14(in_stack_ffffffffffffeeac,
                                                             in_stack_ffffffffffffeea8)))),
                         (uint32_t)((ulong)in_stack_ffffffffffffeea0 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffeea0);
            }
          }
          local_588 = local_fb0;
          EVar4 = (**(code **)(*in_RDI + 0x10))(in_RDI,&local_fd8,&local_fc8,(char)*local_fb0,0);
          if (EVar4 != 0) {
            return EVar4;
          }
          local_4f8 = local_fa8;
          local_b0 = local_fa8;
          local_b4 = 0x800;
          *local_fa8 = *local_fa8 | 0x800;
          local_1020 = 0;
        }
      }
    }
    local_1024 = 0;
LAB_00133949:
    for (local_1028 = 0; local_1028 < local_f54; local_1028 = local_1028 + 1) {
      local_1030 = auStack_e24 + (ulong)local_1028 * 2;
      local_6c = 0x800;
      local_4e8 = local_1030;
      local_78 = local_1030;
      local_68 = local_1030;
      bVar1 = Support::test<unsigned_int,unsigned_int>(*local_1030,0x800);
      if (!bVar1) {
        local_788 = local_1030;
        local_180 = local_1030;
        local_184 = 0x100;
        bVar1 = Support::test<unsigned_int,unsigned_int>(*local_1030,0x100);
        if (bVar1) {
          local_1038 = local_1030;
          local_1040 = local_1030 + 1;
          local_658 = local_1030;
          local_6a8 = local_a08;
          local_6a9 = (undefined1)(*local_1030 >> 0x18);
          local_550 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                      operator[]<asmjit::v1_14::RegType>
                                ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                 in_stack_ffffffffffffeea0,
                                 (RegType *)
                                 CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
          local_1041 = (byte)(local_550->_bits >> 8) & 0xf;
          local_660 = local_1040;
          local_6b8 = local_a08;
          local_6b9 = (undefined1)(*local_1040 >> 0x18);
          local_c8 = local_550;
          local_548 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                      operator[]<asmjit::v1_14::RegType>
                                ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                 in_stack_ffffffffffffeea0,
                                 (RegType *)
                                 CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
          local_1042 = (byte)(local_548->_bits >> 8) & 0xf;
          local_8a0 = local_1038;
          local_1048 = (*local_1038 & 0xff0000) >> 0x10;
          local_8a8 = local_1040;
          local_104c = (*local_1040 & 0xff0000) >> 0x10;
          local_d0 = local_548;
          if (local_1041 != local_1042) {
            EVar4 = DebugUtils::errored(0x19);
            return EVar4;
          }
          local_1058 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                       operator[]<asmjit::v1_14::RegGroup>
                                 ((Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL> *)
                                  in_stack_ffffffffffffeea0,
                                  (RegGroup *)
                                  CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
          bVar1 = FuncArgsContext::WorkData::isAssigned
                            (in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c);
          if ((bVar1) && (local_1048 != local_104c)) {
            local_1088 = (uint)local_1058->_physToVarId[local_104c];
            uVar8 = (ulong)local_1088;
            local_1090 = auStack_e24 + uVar8 * 2;
            local_4a8 = auStack_e24 + uVar8 * 2 + 1;
            if (*local_4a8 != 0) {
              local_790 = auStack_e24 + uVar8 * 2 + 1;
              local_174 = 0x100;
              local_170 = local_790;
              bVar1 = Support::test<unsigned_int,unsigned_int>(*local_790,0x100);
              if ((!bVar1) ||
                 (local_8b8 = local_1090 + 1, (*local_8b8 & 0xff0000) >> 0x10 != local_1048)) {
                local_1024 = local_1024 | 2;
                goto LAB_001347cf;
              }
            }
            local_498 = local_a08;
            local_499 = local_1041;
            local_40 = local_a08;
            local_41 = local_1041;
            local_42 = kRegSwap;
            pIVar6 = Support::Array<asmjit::v1_14::InstHints,_4UL>::
                     operator[]<asmjit::v1_14::RegGroup>
                               ((Array<asmjit::v1_14::InstHints,_4UL> *)in_stack_ffffffffffffeea0,
                                (RegGroup *)
                                CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
            bVar1 = Support::test<asmjit::v1_14::InstHints,asmjit::v1_14::InstHints>
                              (*pIVar6,local_42);
            if (bVar1) {
              local_680 = local_1038;
              local_1092 = (byte)(*local_1038 >> 0x18);
              local_688 = local_1090;
              local_1093 = (byte)(*local_1090 >> 0x18);
              local_488 = &local_1092;
              local_490 = &local_1093;
              in_stack_ffffffffffffeeae = local_1092;
              if (local_1092 < local_1093) {
                in_stack_ffffffffffffeeae = local_1093;
              }
              local_1094 = 3;
              local_1095 = 5;
              local_470 = &local_1091;
              local_478 = &local_1094;
              local_480 = &local_1095;
              local_32 = 3;
              if (2 < in_stack_ffffffffffffeeae) {
                local_e2 = 5;
                local_e1 = in_stack_ffffffffffffeeae;
              }
              in_stack_ffffffffffffeead =
                   2 < in_stack_ffffffffffffeeae && in_stack_ffffffffffffeeae < 6;
              local_1091 = in_stack_ffffffffffffeeae;
              if ((bool)in_stack_ffffffffffffeead) {
                local_1091 = 6;
              }
              local_5f8 = local_a08;
              local_5f9 = local_1091;
              local_34 = local_1093;
              local_33 = local_1092;
              local_31 = in_stack_ffffffffffffeeae;
              pOVar5 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                       operator[]<asmjit::v1_14::RegType>
                                 ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                  in_stack_ffffffffffffeea0,
                                  (RegType *)
                                  CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
              local_109c = pOVar5->_bits;
              local_968 = &local_10b0;
              local_970 = &local_109c;
              local_974 = local_104c;
              local_364 = local_104c;
              local_368 = 0;
              local_36c = 0;
              local_10ac = local_104c;
              local_10a8 = 0;
              local_10a4 = 0;
              local_950 = &local_10c0;
              local_958 = &local_109c;
              local_95c = local_1048;
              local_384 = local_1048;
              local_388 = 0;
              local_38c = 0;
              local_10bc = local_1048;
              local_10b8 = 0;
              local_10b4 = 0;
              local_5f0 = local_109c;
              local_380 = local_958;
              local_378 = local_950;
              local_360 = local_970;
              local_358 = local_968;
              local_10c0 = local_109c;
              local_10b0 = local_109c;
              local_10a0 = (**(code **)(*in_RDI + 0x18))(in_RDI,&local_10b0,&local_10c0,0);
              if (local_10a0 != 0) {
                return local_10a0;
              }
              FuncArgsContext::WorkData::swap
                        (in_stack_ffffffffffffeeb0,
                         CONCAT13(in_stack_ffffffffffffeeaf,
                                  CONCAT12(in_stack_ffffffffffffeeae,
                                           CONCAT11(in_stack_ffffffffffffeead,
                                                    in_stack_ffffffffffffeeac))),
                         in_stack_ffffffffffffeea8,
                         (uint32_t)((ulong)in_stack_ffffffffffffeea0 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffeea0);
              local_450 = local_1038;
              local_454 = local_104c;
              local_30 = local_104c << 0x10;
              local_28 = local_1038;
              local_2c = 0xff0000;
              *local_1038 = *local_1038 & 0xff00ffff | local_30;
              local_508 = local_1030;
              local_90 = local_1030;
              local_94 = 0x800;
              *local_1030 = *local_1030 | 0x800;
              local_460 = local_1090;
              local_464 = local_1048;
              local_20 = local_1048 << 0x10;
              local_18 = local_1090;
              local_1c = 0xff0000;
              *local_1090 = *local_1090 & 0xff00ffff | local_20;
              local_4b0 = local_1090 + 1;
              if (*local_4b0 != 0) {
                local_510 = local_1090;
                local_80 = local_1090;
                local_84 = 0x800;
                *local_1090 = *local_1090 | 0x800;
              }
              local_1024 = local_1024 | 1;
            }
            else {
              local_530 = local_1058;
              local_10c4 = local_1058->_workRegs & (local_1058->_assignedRegs ^ 0xffffffff);
              if (local_10c4 != 0) {
                local_448 = local_1058;
                local_10c8 = local_1058->_dstRegs;
                if ((local_10c4 & (local_10c8 ^ 0xffffffff)) != 0) {
                  local_10c4 = (local_10c8 ^ 0xffffffff) & local_10c4;
                }
                local_51c = local_10c4;
                local_438 = &local_51c;
                local_520 = local_10c4;
                local_8 = &local_520;
                local_104c = 0;
                if (local_10c4 != 0) {
                  for (; (local_10c4 >> local_104c & 1) == 0; local_104c = local_104c + 1) {
                  }
                }
                goto LAB_00133c16;
              }
              local_1024 = local_1024 | 2;
            }
          }
          else {
LAB_00133c16:
            local_668 = local_1040;
            local_5d8 = local_a08;
            local_5d9 = (undefined1)(*local_1040 >> 0x18);
            pOVar5 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                     operator[]<asmjit::v1_14::RegType>
                               ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                in_stack_ffffffffffffeea0,
                                (RegType *)
                                CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
            local_1070 = pOVar5->_bits;
            local_998 = &local_106c;
            local_9a0 = &local_1070;
            local_9a4 = local_104c;
            local_324 = local_104c;
            local_328 = 0;
            local_32c = 0;
            local_1068 = local_104c;
            local_1064 = 0;
            local_1060 = 0;
            local_590 = local_1040;
            in_stack_ffffffffffffeeaf = (undefined1)*local_1040;
            local_670 = local_1038;
            local_5e8 = local_a08;
            local_5e9 = (undefined1)(*local_1038 >> 0x18);
            local_5d0 = local_1070;
            local_320 = local_9a0;
            local_318 = local_998;
            local_106c = local_1070;
            pOVar5 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                     operator[]<asmjit::v1_14::RegType>
                               ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                in_stack_ffffffffffffeea0,
                                (RegType *)
                                CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
            local_1084 = pOVar5->_bits;
            local_980 = &local_1080;
            local_988 = &local_1084;
            local_98c = local_1048;
            local_344 = local_1048;
            local_348 = 0;
            local_34c = 0;
            local_107c = local_1048;
            local_1078 = 0;
            local_1074 = 0;
            local_598 = local_1038;
            local_5e0 = local_1084;
            local_340 = local_988;
            local_338 = local_980;
            local_1080 = local_1084;
            local_105c = (**(code **)(*in_RDI + 0x20))
                                   (in_RDI,&local_106c,in_stack_ffffffffffffeeaf,&local_1080,
                                    (char)*local_1038);
            if (local_105c != 0) {
              return local_105c;
            }
            if (local_1048 != local_104c) {
              FuncArgsContext::WorkData::reassign
                        (in_stack_ffffffffffffeeb0,
                         CONCAT13(in_stack_ffffffffffffeeaf,
                                  CONCAT12(in_stack_ffffffffffffeeae,
                                           CONCAT11(in_stack_ffffffffffffeead,
                                                    in_stack_ffffffffffffeeac))),
                         in_stack_ffffffffffffeea8,
                         (uint32_t)((ulong)in_stack_ffffffffffffeea0 >> 0x20));
            }
            local_678 = local_1040;
            local_4b9 = (byte)(*local_1040 >> 0x18);
            local_5a0 = local_1040;
            local_4b8 = local_1038;
            local_4c0 = local_104c;
            local_4c1 = (undefined1)*local_1040;
            local_4c8 = 0;
            *local_1038 = (uint)local_4b9 << 0x18 | local_104c << 0x10 | *local_1040 & 0xff | 0x100;
            local_8b0 = local_1040;
            if (local_104c == (*local_1040 & 0xff0000) >> 0x10) {
              local_500 = local_1030;
              local_a0 = local_1030;
              local_a4 = 0x800;
              *local_1030 = *local_1030 | 0x800;
            }
            local_1024 = local_1024 | 3;
          }
        }
      }
LAB_001347cf:
    }
    if ((local_1024 & 2) == 0) {
      if ((local_f2f & 1) != 0) {
        local_10cc = 1;
        local_920 = local_9f0;
        if (*(byte *)((long)&local_9f0->_usedRegs + 2) <=
            *(byte *)((long)&local_9f0->_assignedRegs + 1)) {
          local_910 = local_9f0;
          local_2d8 = local_9f0;
          local_2dc = 0x10;
          bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                            (((WorkData *)&local_9f0->_archRegs)->_archRegs,kHasPreservedFP);
          if (!bVar1) {
            if (local_f58 < local_f54) {
              local_8c0 = auStack_e24 + (ulong)local_f58 * 2;
              in_stack_ffffffffffffeea8 = (*local_8c0 & 0xff0000) >> 0x10;
            }
            else {
              local_878 = local_9f0;
              in_stack_ffffffffffffeea8 = (uint)*(byte *)((long)&local_9f0->_workRegs + 2);
            }
            local_8f8 = &local_f78;
            local_f78 = CONCAT44(in_stack_ffffffffffffeea8,(uint)local_f78);
            local_8fc = in_stack_ffffffffffffeea8;
          }
        }
        local_840 = &local_f78;
        local_864 = local_f78._4_4_;
        local_860 = local_9f0;
        if (local_f78._4_4_ == *(byte *)((long)&local_9f0->_workRegs + 1)) {
          local_2c8 = local_9f0;
          varId_00 = ((OperandSignature *)(local_9f0->_physToVarId + 4))->_bits;
        }
        else {
          local_2b8 = local_9f0;
          varId_00 = ((OperandSignature *)(local_9f0->_physToVarId + 8))->_bits;
        }
        local_7c8 = &local_10dc;
        local_7d0 = &local_f78;
        local_2a8 = 2;
        local_2a4 = 2;
        local_7e0[1] = 2;
        local_245 = (byte)((uint)local_f78 >> 3) & 0x1f;
        local_7e0[0] = (uint)local_245 << 3;
        local_288 = local_7e0 + 1;
        local_290 = local_7e0;
        local_7e0[2] = local_7e0[0] | 2;
        local_404 = local_f78._4_4_;
        local_400 = local_7e0 + 2;
        local_408 = 0;
        uStack_10d8 = local_f78._4_4_;
        local_10d4 = 0;
        this_00 = local_9f0;
        local_7d4 = varId_00;
        local_7c0 = local_7d0;
        local_40c = varId_00;
        local_3f8 = local_7c8;
        local_27c = local_7e0[2];
        local_244 = local_7e0[0];
        local_230 = local_7d0;
        local_208 = local_7d0;
        local_200 = local_7d0;
        local_10dc._bits = local_7e0[2];
        uStack_10d0 = varId_00;
        for (local_10e0 = 0; local_10e0 < local_10cc; local_10e0 = local_10e0 + 1) {
          for (local_10e4 = 0; local_10e4 < local_f54; local_10e4 = local_10e4 + 1) {
            uVar8 = (ulong)local_10e4;
            puVar7 = auStack_e24 + uVar8 * 2;
            local_54 = 0x800;
            local_4f0 = puVar7;
            local_60 = puVar7;
            local_50 = puVar7;
            bVar1 = Support::test<unsigned_int,unsigned_int>(*puVar7,0x800);
            if (!bVar1) {
              local_124 = 0x200;
              local_7b8 = puVar7;
              local_120 = puVar7;
              bVar1 = Support::test<unsigned_int,unsigned_int>(*puVar7,0x200);
              if (bVar1) {
                local_798 = auStack_e24 + uVar8 * 2 + 1;
                local_164 = 0x100;
                local_160 = local_798;
                bVar1 = Support::test<unsigned_int,unsigned_int>(*local_798,0x100);
                if (!bVar1) {
                  DebugUtils::assertionFailed
                            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff29c,
                             in_stack_fffffffffffff290);
                }
                local_8c8 = auStack_e24 + uVar8 * 2 + 1;
                uVar3 = (*local_8c8 & 0xff0000) >> 0x10;
                local_690 = auStack_e24 + uVar8 * 2 + 1;
                local_10f5 = (byte)(*local_690 >> 0x18);
                local_6c8 = local_a08;
                local_6c9 = local_10f5;
                local_540 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                            operator[]<asmjit::v1_14::RegType>
                                      ((Array<asmjit::v1_14::OperandSignature,_32UL> *)this_00,
                                       (RegType *)CONCAT44(varId_00,in_stack_ffffffffffffee98));
                local_10f6 = (byte)(local_540->_bits >> 8) & 0xf;
                local_d8 = local_540;
                local_1100 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                             operator[]<asmjit::v1_14::RegGroup>
                                       ((Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL> *)
                                        this_00,(RegGroup *)
                                                CONCAT44(varId_00,in_stack_ffffffffffffee98));
                local_848 = &local_f78;
                if ((uVar3 == local_f78._4_4_) && (local_10f6 == 0)) {
                  if (local_10cc == 1) {
                    local_10cc = 2;
                    goto LAB_001350a6;
                  }
                  FuncArgsContext::WorkData::unassign
                            ((WorkData *)
                             CONCAT17(in_stack_ffffffffffffeeaf,
                                      CONCAT16(in_stack_ffffffffffffeeae,
                                               CONCAT15(in_stack_ffffffffffffeead,
                                                        CONCAT14(in_stack_ffffffffffffeeac,
                                                                 in_stack_ffffffffffffeea8)))),
                             (uint32_t)((ulong)this_00 >> 0x20),(uint32_t)this_00);
                }
                local_608 = local_a08;
                local_609 = local_10f5;
                pOVar5 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                         operator[]<asmjit::v1_14::RegType>
                                   ((Array<asmjit::v1_14::OperandSignature,_32UL> *)this_00,
                                    (RegType *)CONCAT44(varId_00,in_stack_ffffffffffffee98));
                local_1114 = pOVar5->_bits;
                local_938 = &local_1110;
                local_940 = &local_1114;
                local_3a8 = 0;
                local_3ac = 0;
                local_1108 = 0;
                local_1104 = 0;
                local_758 = (long)((int)*puVar7 >> 0xc);
                local_748 = &local_1124;
                local_750 = &local_10dc;
                local_f0 = &local_1124;
                local_1124._baseId = uStack_10d8;
                local_1124._signature._bits = local_10dc._bits;
                local_1124._data[1] = uStack_10d0;
                local_1124._data[0] = local_10d4;
                local_944 = uVar3;
                local_710 = puVar7;
                local_600 = local_1114;
                local_3a4 = uVar3;
                local_3a0 = local_940;
                local_398 = local_938;
                local_f8 = local_750;
                local_1110 = local_1114;
                local_110c = uVar3;
                BaseMem::addOffset((BaseMem *)&local_1124,local_758);
                local_5a8 = auStack_e24 + uVar8 * 2 + 1;
                local_5b0 = puVar7;
                EVar4 = (**(code **)(*in_RDI + 0x20))
                                  (in_RDI,&local_1110,(char)*local_5a8,&local_1124,(char)*puVar7,0);
                if (EVar4 != 0) {
                  return EVar4;
                }
                FuncArgsContext::WorkData::assign(this_00,varId_00,in_stack_ffffffffffffee98);
                local_4d1 = local_10f5;
                local_4d9 = (undefined1)*puVar7;
                local_4e0 = 0x800;
                local_5b8 = puVar7;
                local_4d8 = uVar3;
                local_4d0 = puVar7;
                *puVar7 = (uint)local_10f5 << 0x18 | uVar3 << 0x10 | *puVar7 & 0xff | 0x900;
              }
            }
LAB_001350a6:
          }
        }
      }
      return 0;
    }
    if ((local_1024 & 5) != 4) {
      uVar3 = local_1024 & 1;
      local_1024 = 4;
      if (uVar3 != 0) {
        local_1024 = 0;
      }
      goto LAB_00133949;
    }
    local_9dc = DebugUtils::errored(3);
  }
  return local_9dc;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseEmitHelper::emitArgsAssignment(const FuncFrame& frame, const FuncArgsAssignment& args) {
  typedef FuncArgsContext::Var Var;
  typedef FuncArgsContext::WorkData WorkData;

  enum WorkFlags : uint32_t {
    kWorkNone      = 0x00,
    kWorkDidSome   = 0x01,
    kWorkPending   = 0x02,
    kWorkPostponed = 0x04
  };

  Arch arch = frame.arch();
  const ArchTraits& archTraits = ArchTraits::byArch(arch);

  RAConstraints constraints;
  FuncArgsContext ctx;

  ASMJIT_PROPAGATE(constraints.init(arch));
  ASMJIT_PROPAGATE(ctx.initWorkData(frame, args, &constraints));

#ifdef ASMJIT_DUMP_ARGS_ASSIGNMENT
  {
    String sb;
    dumpAssignment(sb, ctx);
    printf("%s\n", sb.data());
  }
#endif

  auto& workData = ctx._workData;
  uint32_t varCount = ctx._varCount;
  uint32_t saVarId = ctx._saVarId;

  BaseReg sp = BaseReg(_emitter->_gpSignature, archTraits.spRegId());
  BaseReg sa = sp;

  if (frame.hasDynamicAlignment()) {
    if (frame.hasPreservedFP())
      sa.setId(archTraits.fpRegId());
    else
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());
  }

  // Register to stack and stack to stack moves must be first as now we have
  // the biggest chance of having as many as possible unassigned registers.

  if (ctx._stackDstMask) {
    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));
    BaseMem baseStackPtr(sp, 0);

    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];

      if (!var.out.isStack())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      ASMJIT_ASSERT(cur.isReg() || cur.isStack());
      BaseReg reg;

      BaseMem dstStackPtr = baseStackPtr.cloneAdjusted(out.stackOffset());
      BaseMem srcStackPtr = baseArgPtr.cloneAdjusted(cur.stackOffset());

      if (cur.isIndirect()) {
        if (cur.isStack()) {
          // TODO: Indirect stack.
          return DebugUtils::errored(kErrorInvalidAssignment);
        }
        else {
          srcStackPtr.setBaseId(cur.regId());
        }
      }

      if (cur.isReg() && !cur.isIndirect()) {
        WorkData& wd = workData[archTraits.regTypeToGroup(cur.regType())];
        uint32_t regId = cur.regId();

        reg.setSignatureAndId(archTraits.regTypeToSignature(cur.regType()), regId);
        wd.unassign(varId, regId);
      }
      else {
        // Stack to reg move - tricky since we move stack to stack we can decide which register to use. In general
        // we follow the rule that IntToInt moves will use GP regs with possibility to signature or zero extend,
        // and all other moves will either use GP or VEC regs depending on the size of the move.
        OperandSignature signature = getSuitableRegForMemToMemMove(arch, out.typeId(), cur.typeId());
        if (ASMJIT_UNLIKELY(!signature.isValid()))
          return DebugUtils::errored(kErrorInvalidState);

        WorkData& wd = workData[signature.regGroup()];
        RegMask availableRegs = wd.availableRegs();
        if (ASMJIT_UNLIKELY(!availableRegs))
          return DebugUtils::errored(kErrorInvalidState);

        uint32_t availableId = Support::ctz(availableRegs);
        reg.setSignatureAndId(signature, availableId);

        ASMJIT_PROPAGATE(emitArgMove(reg, out.typeId(), srcStackPtr, cur.typeId()));
      }

      if (cur.isIndirect() && cur.isReg())
        workData[RegGroup::kGp].unassign(varId, cur.regId());

      // Register to stack move.
      ASMJIT_PROPAGATE(emitRegMove(dstStackPtr, reg, cur.typeId()));
      var.markDone();
    }
  }

  // Shuffle all registers that are currently assigned accordingly to target assignment.

  uint32_t workFlags = kWorkNone;
  for (;;) {
    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];
      if (var.isDone() || !var.cur.isReg())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      RegGroup curGroup = archTraits.regTypeToGroup(cur.regType());
      RegGroup outGroup = archTraits.regTypeToGroup(out.regType());

      uint32_t curId = cur.regId();
      uint32_t outId = out.regId();

      if (curGroup != outGroup) {
        // TODO: Conversion is not supported.
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
      else {
        WorkData& wd = workData[outGroup];
        if (!wd.isAssigned(outId) || curId == outId) {
EmitMove:
          ASMJIT_PROPAGATE(
            emitArgMove(
              BaseReg(archTraits.regTypeToSignature(out.regType()), outId), out.typeId(),
              BaseReg(archTraits.regTypeToSignature(cur.regType()), curId), cur.typeId()));

          // Only reassign if this is not a sign/zero extension that happens on the same in/out register.
          if (curId != outId)
            wd.reassign(varId, outId, curId);

          cur.initReg(out.regType(), outId, out.typeId());

          if (outId == out.regId())
            var.markDone();
          workFlags |= kWorkDidSome | kWorkPending;
        }
        else {
          uint32_t altId = wd._physToVarId[outId];
          Var& altVar = ctx._vars[altId];

          if (!altVar.out.isInitialized() || (altVar.out.isReg() && altVar.out.regId() == curId)) {
            // Only few architectures provide swap operations, and only for few register groups.
            if (archTraits.hasInstRegSwap(curGroup)) {
              RegType highestType = Support::max(cur.regType(), altVar.cur.regType());
              if (Support::isBetween(highestType, RegType::kGp8Lo, RegType::kGp16))
                highestType = RegType::kGp32;

              OperandSignature signature = archTraits.regTypeToSignature(highestType);
              ASMJIT_PROPAGATE(
                emitRegSwap(BaseReg(signature, outId), BaseReg(signature, curId)));

              wd.swap(varId, curId, altId, outId);
              cur.setRegId(outId);
              var.markDone();
              altVar.cur.setRegId(curId);

              if (altVar.out.isInitialized())
                altVar.markDone();
              workFlags |= kWorkDidSome;
            }
            else {
              // If there is a scratch register it can be used to perform the swap.
              RegMask availableRegs = wd.availableRegs();
              if (availableRegs) {
                RegMask inOutRegs = wd.dstRegs();
                if (availableRegs & ~inOutRegs)
                  availableRegs &= ~inOutRegs;
                outId = Support::ctz(availableRegs);
                goto EmitMove;
              }
              else {
                workFlags |= kWorkPending;
              }
            }
          }
          else {
            workFlags |= kWorkPending;
          }
        }
      }
    }

    if (!(workFlags & kWorkPending))
      break;

    // If we did nothing twice it means that something is really broken.
    if ((workFlags & (kWorkDidSome | kWorkPostponed)) == kWorkPostponed)
      return DebugUtils::errored(kErrorInvalidState);

    workFlags = (workFlags & kWorkDidSome) ? kWorkNone : kWorkPostponed;
  }

  // Load arguments passed by stack into registers. This is pretty simple and
  // it never requires multiple iterations like the previous phase.

  if (ctx._hasStackSrc) {
    uint32_t iterCount = 1;
    if (frame.hasDynamicAlignment() && !frame.hasPreservedFP())
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());

    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));

    for (uint32_t iter = 0; iter < iterCount; iter++) {
      for (uint32_t varId = 0; varId < varCount; varId++) {
        Var& var = ctx._vars[varId];
        if (var.isDone())
          continue;

        if (var.cur.isStack()) {
          ASMJIT_ASSERT(var.out.isReg());

          uint32_t outId = var.out.regId();
          RegType outType = var.out.regType();

          RegGroup group = archTraits.regTypeToGroup(outType);
          WorkData& wd = workData[group];

          if (outId == sa.id() && group == RegGroup::kGp) {
            // This register will be processed last as we still need `saRegId`.
            if (iterCount == 1) {
              iterCount++;
              continue;
            }
            wd.unassign(wd._physToVarId[outId], outId);
          }

          BaseReg dstReg = BaseReg(archTraits.regTypeToSignature(outType), outId);
          BaseMem srcMem = baseArgPtr.cloneAdjusted(var.cur.stackOffset());

          ASMJIT_PROPAGATE(emitArgMove(
            dstReg, var.out.typeId(),
            srcMem, var.cur.typeId()));

          wd.assign(varId, outId);
          var.cur.initReg(outType, outId, var.cur.typeId(), FuncValue::kFlagIsDone);
        }
      }
    }
  }

  return kErrorOk;
}